

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void libtorrent::aux::apply_deprecated_dht_settings
               (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                *sett,bdecode_node *s)

{
  undefined8 uVar1;
  pointer pbVar2;
  bool bVar3;
  int64_t iVar4;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  bdecode_node val;
  bdecode_node local_98;
  undefined1 local_58 [16];
  pointer local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  char *pcStack_38;
  int iStack_30;
  int iStack_2c;
  undefined8 uStack_28;
  int iStack_20;
  
  pcStack_38 = (char *)0x0;
  iStack_30 = 0;
  local_48 = (pointer)0x0;
  local_40 = 0;
  uStack_3c = 0;
  local_58 = (undefined1  [16])0x0;
  iStack_2c = -1;
  uStack_28._0_4_ = -1;
  uStack_28._4_4_ = -1;
  iStack_20 = -1;
  key._M_str = "max_peers_reply";
  key._M_len = 0xf;
  bdecode_node::dict_find_int(&local_98,s,key);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4089,(int)iVar4);
  }
  key_00._M_str = "search_branching";
  key_00._M_len = 0x10;
  bdecode_node::dict_find_int(&local_98,s,key_00);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408a,(int)iVar4);
  }
  key_01._M_str = "max_fail_count";
  key_01._M_len = 0xe;
  bdecode_node::dict_find_int(&local_98,s,key_01);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408b,(int)iVar4);
  }
  key_02._M_str = "max_torrents";
  key_02._M_len = 0xc;
  bdecode_node::dict_find_int(&local_98,s,key_02);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408c,(int)iVar4);
  }
  key_03._M_str = "max_dht_items";
  key_03._M_len = 0xd;
  bdecode_node::dict_find_int(&local_98,s,key_03);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408d,(int)iVar4);
  }
  key_04._M_str = "max_peers";
  key_04._M_len = 9;
  bdecode_node::dict_find_int(&local_98,s,key_04);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408e,(int)iVar4);
  }
  key_05._M_str = "max_torrent_search_reply";
  key_05._M_len = 0x18;
  bdecode_node::dict_find_int(&local_98,s,key_05);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408f,(int)iVar4);
  }
  key_06._M_str = "restrict_routing_ips";
  key_06._M_len = 0x14;
  bdecode_node::dict_find_int(&local_98,s,key_06);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8046,iVar4 != 0);
  }
  key_07._M_str = "restrict_search_ips";
  key_07._M_len = 0x13;
  bdecode_node::dict_find_int(&local_98,s,key_07);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8047,iVar4 != 0);
  }
  key_08._M_str = "extended_routing_table";
  key_08._M_len = 0x16;
  bdecode_node::dict_find_int(&local_98,s,key_08);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8048,iVar4 != 0);
  }
  key_09._M_str = "aggressive_lookups";
  key_09._M_len = 0x12;
  bdecode_node::dict_find_int(&local_98,s,key_09);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8049,iVar4 != 0);
  }
  key_10._M_str = "privacy_lookups";
  key_10._M_len = 0xf;
  bdecode_node::dict_find_int(&local_98,s,key_10);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804a,iVar4 != 0);
  }
  key_11._M_str = "enforce_node_id";
  key_11._M_len = 0xf;
  bdecode_node::dict_find_int(&local_98,s,key_11);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804b,iVar4 != 0);
  }
  key_12._M_str = "ignore_dark_internet";
  key_12._M_len = 0x14;
  bdecode_node::dict_find_int(&local_98,s,key_12);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804c,iVar4 != 0);
  }
  key_13._M_str = "block_timeout";
  key_13._M_len = 0xd;
  bdecode_node::dict_find_int(&local_98,s,key_13);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4090,(int)iVar4);
  }
  key_14._M_str = "block_ratelimit";
  key_14._M_len = 0xf;
  bdecode_node::dict_find_int(&local_98,s,key_14);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4091,(int)iVar4);
  }
  key_15._M_str = "read_only";
  key_15._M_len = 9;
  bdecode_node::dict_find_int(&local_98,s,key_15);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804d,iVar4 != 0);
  }
  key_16._M_str = "item_lifetime";
  key_16._M_len = 0xd;
  bdecode_node::dict_find_int(&local_98,s,key_16);
  pbVar2 = local_48;
  uVar1 = local_58._0_8_;
  local_58._8_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_98.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_98.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pbVar2 - uVar1);
  }
  iStack_20 = local_98.m_size;
  iStack_30 = local_98.m_buffer_size;
  iStack_2c = local_98.m_token_idx;
  uStack_28._0_4_ = local_98.m_last_index;
  uStack_28._4_4_ = local_98.m_last_token;
  local_40 = SUB84(local_98.m_root_tokens,0);
  uStack_3c = (undefined4)((ulong)local_98.m_root_tokens >> 0x20);
  pcStack_38 = local_98.m_buffer;
  if (local_98.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar3) {
    iVar4 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4092,(int)iVar4);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
  }
  return;
}

Assistant:

void apply_deprecated_dht_settings(settings_pack& sett, bdecode_node const& s)
{
	bdecode_node val;
	val = s.dict_find_int("max_peers_reply");
	if (val) sett.set_int(settings_pack::dht_max_peers_reply, int(val.int_value()));
	val = s.dict_find_int("search_branching");
	if (val) sett.set_int(settings_pack::dht_search_branching, int(val.int_value()));
	val = s.dict_find_int("max_fail_count");
	if (val) sett.set_int(settings_pack::dht_max_fail_count, int(val.int_value()));
	val = s.dict_find_int("max_torrents");
	if (val) sett.set_int(settings_pack::dht_max_torrents, int(val.int_value()));
	val = s.dict_find_int("max_dht_items");
	if (val) sett.set_int(settings_pack::dht_max_dht_items, int(val.int_value()));
	val = s.dict_find_int("max_peers");
	if (val) sett.set_int(settings_pack::dht_max_peers, int(val.int_value()));
	val = s.dict_find_int("max_torrent_search_reply");
	if (val) sett.set_int(settings_pack::dht_max_torrent_search_reply, int(val.int_value()));
	val = s.dict_find_int("restrict_routing_ips");
	if (val) sett.set_bool(settings_pack::dht_restrict_routing_ips, (val.int_value() != 0));
	val = s.dict_find_int("restrict_search_ips");
	if (val) sett.set_bool(settings_pack::dht_restrict_search_ips, (val.int_value() != 0));
	val = s.dict_find_int("extended_routing_table");
	if (val) sett.set_bool(settings_pack::dht_extended_routing_table, (val.int_value() != 0));
	val = s.dict_find_int("aggressive_lookups");
	if (val) sett.set_bool(settings_pack::dht_aggressive_lookups, (val.int_value() != 0));
	val = s.dict_find_int("privacy_lookups");
	if (val) sett.set_bool(settings_pack::dht_privacy_lookups, (val.int_value() != 0));
	val = s.dict_find_int("enforce_node_id");
	if (val) sett.set_bool(settings_pack::dht_enforce_node_id, (val.int_value() != 0));
	val = s.dict_find_int("ignore_dark_internet");
	if (val) sett.set_bool(settings_pack::dht_ignore_dark_internet, (val.int_value() != 0));
	val = s.dict_find_int("block_timeout");
	if (val) sett.set_int(settings_pack::dht_block_timeout, int(val.int_value()));
	val = s.dict_find_int("block_ratelimit");
	if (val) sett.set_int(settings_pack::dht_block_ratelimit, int(val.int_value()));
	val = s.dict_find_int("read_only");
	if (val) sett.set_bool(settings_pack::dht_read_only, (val.int_value() != 0));
	val = s.dict_find_int("item_lifetime");
	if (val) sett.set_int(settings_pack::dht_item_lifetime, int(val.int_value()));
}